

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *pNew,Abc_Ntk_t *pNtk,int *pCounter,Vec_Int_t *vBufs)

{
  undefined4 uVar1;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  long *plVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pNode;
  ulong uVar7;
  Abc_Obj_t *pAVar8;
  char *__assertion;
  int iVar9;
  long lVar10;
  int i;
  
  p = (Vec_Ptr_t *)pNtk->pData;
  *pCounter = *pCounter + 1;
  i = 0;
  do {
    if (p->nSize <= i) {
      return;
    }
    pNode = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar4 == 7) {
      iVar5 = Abc_NodeStrashToGia(pNew,pNode);
      *(int *)((long)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray] + 0x40) = iVar5;
    }
    else {
      if (uVar4 == 8) {
        __assertion = "!Abc_ObjIsLatch(pObj)";
        uVar4 = 0x67;
LAB_006a9092:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,uVar4,
                      "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                     );
      }
      pNtk_00 = *(Abc_Ntk_t **)&(pNode->field_5).iData;
      if (pNtk_00->vPis->nSize != (pNode->vFanins).nSize) {
        __assertion = "Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj)";
        uVar4 = 0x68;
        goto LAB_006a9092;
      }
      if (pNtk_00->vPos->nSize != (pNode->vFanouts).nSize) {
        __assertion = "Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj)";
        uVar4 = 0x69;
        goto LAB_006a9092;
      }
      iVar5 = pNew->nBufs;
      Abc_NtkFillTemp(pNtk_00);
      for (lVar10 = 0; uVar7 = (ulong)(pNode->vFanins).nSize, lVar10 < (long)uVar7;
          lVar10 = lVar10 + 1) {
        plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar10]];
        lVar3 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        if ((*(uint *)(lVar3 + 0x14) & 0xf) != 6) {
          __assertion = "Abc_ObjIsNet(Abc_ObjFanin0(pTerm))";
          uVar4 = 0x6d;
          goto LAB_006a9092;
        }
        uVar1 = *(undefined4 *)(lVar3 + 0x40);
        pAVar8 = Abc_NtkPi(pNtk_00,(int)lVar10);
        *(undefined4 *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray] + 0x40) =
             uVar1;
      }
      if (vBufs == (Vec_Int_t *)0x0) {
        Abc_NtkFlattenHierarchyGia2_rec(pNew,pNtk_00,pCounter,(Vec_Int_t *)0x0);
      }
      else {
        for (iVar9 = 0; iVar9 < (int)uVar7; iVar9 = iVar9 + 1) {
          pAVar8 = Abc_NtkPi(pNtk_00,iVar9);
          iVar6 = Gia_ManAppendBuf(pNew,*(int *)((long)pAVar8->pNtk->vObjs->pArray
                                                       [*(pAVar8->vFanouts).pArray] + 0x40));
          pAVar8 = Abc_NtkPi(pNtk_00,iVar9);
          *(int *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray] + 0x40) = iVar6;
          uVar7 = (ulong)(uint)(pNode->vFanins).nSize;
        }
        Abc_NtkFlattenHierarchyGia2_rec(pNew,pNtk_00,pCounter,vBufs);
        for (iVar9 = 0; iVar9 < (pNode->vFanouts).nSize; iVar9 = iVar9 + 1) {
          pAVar8 = Abc_NtkPo(pNtk_00,iVar9);
          iVar6 = Gia_ManAppendBuf(pNew,*(int *)((long)pAVar8->pNtk->vObjs->pArray
                                                       [*(pAVar8->vFanins).pArray] + 0x40));
          pAVar8 = Abc_NtkPo(pNtk_00,iVar9);
          *(int *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x40) = iVar6;
        }
      }
      for (lVar10 = 0; lVar10 < (pNode->vFanouts).nSize; lVar10 = lVar10 + 1) {
        plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar10]];
        if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[6] * 8) + 0x14) & 0xf) != 6) {
          __assertion = "Abc_ObjIsNet(Abc_ObjFanout0(pTerm))";
          uVar4 = 0x79;
          goto LAB_006a9092;
        }
        pAVar8 = Abc_NtkPo(pNtk_00,(int)lVar10);
        *(undefined4 *)
         (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) + 0x40)
             = *(undefined4 *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x40);
      }
      if (vBufs != (Vec_Int_t *)0x0) {
        Vec_IntPush(vBufs,iVar5);
        Vec_IntPush(vBufs,pNtk_00->vPis->nSize);
        Vec_IntPush(vBufs,pNew->nBufs - pNtk_00->vPos->nSize);
        Vec_IntPush(vBufs,pNtk_00->vPos->nSize);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkFlattenHierarchyGia2_rec( Gia_Man_t * pNew, Abc_Ntk_t * pNtk, int * pCounter, Vec_Int_t * vBufs )
{
    Vec_Ptr_t * vDfs = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm; 
    int i, k; (*pCounter)++;
    //printf( "[%d:%d] ", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vDfs, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
            Abc_ObjFanout0(pObj)->iTemp = Abc_NodeStrashToGia( pNew, pObj );
        else
        {
            int iBufStart = Gia_ManBufNum(pNew);
            Abc_Ntk_t * pModel = (Abc_Ntk_t *)pObj->pData;
            assert( !Abc_ObjIsLatch(pObj) );
            assert( Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj) );
            assert( Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj) );
            Abc_NtkFillTemp( pModel );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanin0(pTerm)) );
                Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
            }
            if ( vBufs )
                Abc_ObjForEachFanin( pObj, pTerm, k )
                    Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp );
            Abc_NtkFlattenHierarchyGia2_rec( pNew, pModel, pCounter, vBufs );
            if ( vBufs )
                Abc_ObjForEachFanout( pObj, pTerm, k )
                    Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp );
            Abc_ObjForEachFanout( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanout0(pTerm)) );
                Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp;
            }
            // save buffers
            if ( vBufs == NULL )
                continue;
            Vec_IntPush( vBufs, iBufStart );
            Vec_IntPush( vBufs, Abc_NtkPiNum(pModel) );
            Vec_IntPush( vBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pModel) );
            Vec_IntPush( vBufs, Abc_NtkPoNum(pModel) );
        }
    }
}